

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall ON_AngularDimension2Extra::CopyFrom(ON_AngularDimension2Extra *this,ON_Object *src)

{
  _func_int **pp_Var1;
  bool bVar2;
  
  if (src == (ON_Object *)0x0) {
    return false;
  }
  bVar2 = ON_Object::IsKindOf(src,&m_ON_AngularDimension2Extra_class_rtti);
  if (bVar2) {
    ON_UserData::operator=(&this->super_ON_UserData,(ON_UserData *)src);
    pp_Var1 = src[0xd]._vptr_ON_Object;
    this->m_dimpoint_offset[0] = (double)src[0xc].m_userdata_list;
    this->m_dimpoint_offset[1] = (double)pp_Var1;
  }
  return bVar2;
}

Assistant:

ON_AngularDimension2Extra* ON_AngularDimension2Extra::AngularDimensionExtra(ON_OBSOLETE_V5_DimAngular* pDim)
{
  ON_AngularDimension2Extra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_AngularDimension2Extra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_AngularDimension2Extra)));
    if(pExtra == 0)
    {
      pExtra = new ON_AngularDimension2Extra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}